

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_populate_ci(ps_alignment_t *al)

{
  int iVar1;
  int iVar2;
  dict_t *pdVar3;
  bin_mdef_t *pbVar4;
  ps_alignment_entry_t *ppVar5;
  ps_alignment_entry_t *ppVar6;
  int local_6c;
  int j_1;
  ps_alignment_entry_t *sent_1;
  ps_alignment_entry_t *pent;
  int j;
  int len;
  int wid;
  ps_alignment_entry_t *sent;
  ps_alignment_entry_t *went;
  int i;
  bin_mdef_t *mdef;
  dict_t *dict;
  dict2pid_t *d2p;
  ps_alignment_t *al_local;
  
  ps_alignment_vector_empty(&al->sseq);
  ps_alignment_vector_empty(&al->state);
  pdVar3 = al->d2p->dict;
  pbVar4 = al->d2p->mdef;
  went._4_4_ = 0;
  do {
    if ((int)(uint)(al->word).n_ent <= went._4_4_) {
      went._4_4_ = 0;
      do {
        if ((int)(uint)(al->sseq).n_ent <= went._4_4_) {
          return 0;
        }
        ppVar5 = (al->sseq).seq + went._4_4_;
        for (local_6c = 0; local_6c < pbVar4->n_emit_state; local_6c = local_6c + 1) {
          ppVar6 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar6 == (ps_alignment_entry_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,0x129,"Failed to add state entry!\n");
            return -1;
          }
          (ppVar6->id).pid.cipid = pbVar4->sseq[(ppVar5->id).pid.ssid][local_6c];
          if ((ppVar6->id).pid.cipid == -1) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0x12d,"int ps_alignment_populate_ci(ps_alignment_t *)");
          }
          ppVar6->start = ppVar5->start;
          ppVar6->duration = ppVar5->duration;
          ppVar6->score = 0;
          ppVar6->parent = went._4_4_;
          if (local_6c == 0) {
            ppVar5->child = (uint)(((long)ppVar6 - (long)(al->state).seq) / 0x1c) & 0xffff;
          }
        }
        went._4_4_ = went._4_4_ + 1;
      } while( true );
    }
    ppVar5 = (al->word).seq + went._4_4_;
    iVar1 = (ppVar5->id).wid;
    iVar2 = pdVar3->word[iVar1].pronlen;
    for (pent._4_4_ = 0; pent._4_4_ < iVar2; pent._4_4_ = pent._4_4_ + 1) {
      ppVar6 = ps_alignment_vector_grow_one(&al->sseq);
      if (ppVar6 == (ps_alignment_entry_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,0x111,"Failed to add phone entry!\n");
        return -1;
      }
      (ppVar6->id).pid.cipid = pdVar3->word[iVar1].ciphone[pent._4_4_];
      (ppVar6->id).pid.tmatid = pbVar4->phone[(ppVar6->id).pid.cipid].tmat;
      (ppVar6->id).pid.ssid = (uint16)pbVar4->phone[(ppVar6->id).pid.cipid].ssid;
      if ((ppVar6->id).pid.ssid == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0x117,"int ps_alignment_populate_ci(ps_alignment_t *)");
      }
      ppVar6->start = ppVar5->start;
      ppVar6->duration = ppVar5->duration;
      ppVar6->score = 0;
      ppVar6->parent = went._4_4_;
    }
    went._4_4_ = went._4_4_ + 1;
  } while( true );
}

Assistant:

int
ps_alignment_populate_ci(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j;

        for (j = 0; j < len; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = bin_mdef_pid2ssid(mdef, sent->id.pid.cipid);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}